

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_mglsa_digital_filter.cc
# Opt level: O0

void __thiscall
sptk::InverseMglsaDigitalFilter::InverseMglsaDigitalFilter
          (InverseMglsaDigitalFilter *this,int num_filter_order,int num_pade_order,int num_stage,
          double alpha,bool transposition)

{
  bool bVar1;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  byte in_R8B;
  double in_XMM0_Qa;
  int in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__InverseMglsaDigitalFilter_0012bb98;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(int *)((long)in_RDI + 0xc) = in_ECX;
  in_RDI[2] = in_XMM0_Qa;
  *(byte *)(in_RDI + 3) = in_R8B & 1;
  MlsaDigitalFilter::MlsaDigitalFilter
            ((MlsaDigitalFilter *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe8,
             in_XMM0_Qa,(bool)(in_R8B & 1));
  *(undefined1 *)(in_RDI + 0xb) = 1;
  if (((*(int *)(in_RDI + 1) < 0) || (*(int *)((long)in_RDI + 0xc) < 0)) ||
     (bVar1 = IsValidAlpha((double)in_RDI[2]), !bVar1)) {
    *(undefined1 *)(in_RDI + 0xb) = 0;
  }
  else if ((in_ECX == 0) &&
          (bVar1 = MlsaDigitalFilter::IsValid((MlsaDigitalFilter *)(in_RDI + 4)), !bVar1)) {
    *(undefined1 *)(in_RDI + 0xb) = 0;
  }
  return;
}

Assistant:

InverseMglsaDigitalFilter::InverseMglsaDigitalFilter(int num_filter_order,
                                                     int num_pade_order,
                                                     int num_stage,
                                                     double alpha,
                                                     bool transposition)
    : num_filter_order_(num_filter_order),
      num_stage_(num_stage),
      alpha_(alpha),
      transposition_(transposition),
      mlsa_digital_filter_(num_filter_order_, num_pade_order, alpha_,
                           transposition_),
      is_valid_(true) {
  if (num_filter_order_ < 0 || num_stage_ < 0 || !sptk::IsValidAlpha(alpha_)) {
    is_valid_ = false;
    return;
  }
  if (0 == num_stage && !mlsa_digital_filter_.IsValid()) {
    is_valid_ = false;
    return;
  }
}